

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_privkey.c
# Opt level: O0

err_t cmdPrivkeyRead(octet *privkey,size_t *privkey_len,char *name,cmd_pwd_t pwd)

{
  err_t eVar1;
  octet *pwd_len;
  size_t *in_RSI;
  long in_RDI;
  octet *epki;
  void *stack;
  size_t epki_len_max;
  size_t epki_len_min;
  size_t epki_len;
  size_t len;
  err_t code;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  octet *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  octet *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  octet *in_stack_ffffffffffffffa8;
  octet *pwd_00;
  size_t *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  octet *privkey_00;
  err_t local_4;
  
  if ((in_RSI == (size_t *)0x0) || (*in_RSI == 0)) {
    in_stack_ffffffffffffffc0 = (size_t *)cmdFileSize(in_stack_ffffffffffffff78);
    if (in_stack_ffffffffffffffc0 == (size_t *)0xffffffffffffffff) {
      return 0xcf;
    }
    privkey_00 = (octet *)0x18;
    while (privkey_00 < (octet *)0x41) {
      eVar1 = bpkiPrivkeyWrap(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff98,
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (octet *)in_stack_ffffffffffffffc0,(size_t)privkey_00);
      if (eVar1 != 0) {
        return eVar1;
      }
      in_stack_ffffffffffffff58 = 0;
      eVar1 = bpkiPrivkeyWrap(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff98,
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (octet *)in_stack_ffffffffffffffc0,(size_t)privkey_00);
      if (eVar1 != 0) {
        return eVar1;
      }
      if ((in_stack_ffffffffffffffb8 <= in_stack_ffffffffffffffc0) &&
         (in_stack_ffffffffffffffc0 <= in_stack_ffffffffffffffb0)) break;
      if (privkey_00 == (octet *)0x18) {
        in_stack_ffffffffffffff98 = (octet *)0x20;
        privkey_00 = in_stack_ffffffffffffff98;
      }
      else {
        in_stack_ffffffffffffff98 = privkey_00 + 0x10;
        privkey_00 = in_stack_ffffffffffffff98;
      }
    }
    if ((octet *)0x40 < privkey_00) {
      return 0x132;
    }
    if (in_RSI != (size_t *)0x0) {
      *in_RSI = (size_t)privkey_00;
    }
  }
  else {
    privkey_00 = (octet *)*in_RSI;
    eVar1 = bpkiPrivkeyWrap(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98,
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            (octet *)in_stack_ffffffffffffffc0,(size_t)privkey_00);
    if (eVar1 != 0) {
      return eVar1;
    }
    in_stack_ffffffffffffff58 = 0;
    eVar1 = bpkiPrivkeyWrap(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98,
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            (octet *)in_stack_ffffffffffffffc0,(size_t)privkey_00);
    if (eVar1 != 0) {
      return eVar1;
    }
  }
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    pwd_len = (octet *)blobCreate(in_stack_ffffffffffffff58);
    local_4 = 0x6e;
    if (pwd_len != (octet *)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      pwd_00 = pwd_len;
      local_4 = cmdFileReadAll(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               in_stack_ffffffffffffff68);
      if (local_4 == 0) {
        local_4 = 0x132;
        if (in_stack_ffffffffffffffb8 <= in_stack_ffffffffffffffc0 &&
            in_stack_ffffffffffffffc0 <= in_stack_ffffffffffffffb0) {
          local_4 = 0;
        }
        if (local_4 == 0) {
          local_4 = cmdFileReadAll(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                   in_stack_ffffffffffffff68);
          if (local_4 == 0) {
            strLen((char *)0x106d5f);
            local_4 = bpkiPrivkeyUnwrap(privkey_00,in_stack_ffffffffffffffc0,
                                        (octet *)in_stack_ffffffffffffffb8,
                                        (size_t)in_stack_ffffffffffffffb0,pwd_00,(size_t)pwd_len);
            if (local_4 == 0) {
              blobClose((blob_t)0x106dac);
            }
            else {
              blobClose((blob_t)0x106d95);
            }
          }
          else {
            blobClose((blob_t)0x106d14);
          }
        }
        else {
          blobClose((blob_t)0x106cd8);
        }
      }
      else {
        blobClose((blob_t)0x106c7f);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdPrivkeyRead(octet privkey[], size_t* privkey_len, const char* name,
	const cmd_pwd_t pwd)
{
	err_t code;
	size_t len;
	size_t epki_len;
	size_t epki_len_min;
	size_t epki_len_max;
	void* stack;
	octet* epki;
	// pre
	ASSERT(memIsNullOrValid(privkey_len, sizeof(size_t)));
	ASSERT(!privkey_len || *privkey_len == 0 || *privkey_len == 24 ||
		*privkey_len == 32 || *privkey_len == 48 ||  *privkey_len == 64);
	ASSERT(strIsValid(name));
	ASSERT(cmdPwdIsValid(pwd));
	// определить длину личного ключа по размеру контейнера
	if (!privkey_len || *privkey_len == 0)
	{
		// определить размер контейнера
		if ((epki_len = cmdFileSize(name)) == SIZE_MAX)
			return ERR_FILE_READ;
		// найти подходящую длину
		for (len = 24; len <= 64; len = len == 24 ? len + 8 : len + 16)
		{
			code = bpkiPrivkeyWrap(0, &epki_len_min, 0, len, 0, 0, 0, 10000);
			ERR_CALL_CHECK(code);
			code = bpkiPrivkeyWrap(0, &epki_len_max, 0, len, 0, 0, 0, SIZE_MAX);
			ERR_CALL_CHECK(code);
			if (epki_len_min <= epki_len && epki_len <= epki_len_max)
				break;
		}
		if (len > 64)
			return ERR_BAD_FORMAT;
		if (privkey_len)
			*privkey_len = len;
	}
	// обработать переданную длину личного ключа
	else
	{
		len = *privkey_len;
		code = bpkiPrivkeyWrap(0, &epki_len_min, 0, len, 0, 0, 0, 10000);
		ERR_CALL_CHECK(code);
		code = bpkiPrivkeyWrap(0, &epki_len_max, 0, len, 0, 0, 0, SIZE_MAX);
		ERR_CALL_CHECK(code);
	}
	// ключ определять не нужно?
	if (!privkey)
		return ERR_OK;
	ASSERT(len == 24 || len == 32 || len == 48 || len == 64);
	ASSERT(memIsValid(privkey, len));
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, epki_len_max + 1);
	ERR_CALL_CHECK(code);
	epki = (octet*)stack;
	// определить длину контейнера
	code = cmdFileReadAll(0, &epki_len, name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить длину
	code = (epki_len_min <= epki_len && epki_len <= epki_len_max) ?
		ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// читать
	code = cmdFileReadAll(epki, &epki_len, name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// снять защиту
	code = bpkiPrivkeyUnwrap(privkey, &epki_len_min, epki, epki_len,
		(const octet*)pwd, cmdPwdLen(pwd));
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	ASSERT(epki_len_min == len);
	cmdBlobClose(stack);
	return code;
}